

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::generateTriangles(Geometry *this,int8 *adc)

{
  uint uVar1;
  MeshHeader *this_00;
  int iVar2;
  int32 iVar3;
  uint local_50;
  uint local_4c;
  uint32 j_2;
  uint32 j_1;
  int32 matid;
  uint32 i_1;
  Triangle *tri;
  uint32 j;
  uint32 i;
  int8 *adcbits;
  Mesh *m;
  MeshHeader *header;
  int8 *adc_local;
  Geometry *this_local;
  
  this_00 = this->meshHeader;
  this->numTriangles = 0;
  adcbits = (int8 *)MeshHeader::getMeshes(this_00);
  _j = adc;
  for (tri._4_4_ = 0; tri._4_4_ < this_00->numMeshes; tri._4_4_ = tri._4_4_ + 1) {
    if (*(uint *)(adcbits + 8) < 3) {
      uVar1 = *(uint *)(adcbits + 8);
    }
    else {
      if (this_00->flags == 1) {
        for (tri._0_4_ = 0; (uint)tri < *(int *)(adcbits + 8) - 2U; tri._0_4_ = (uint)tri + 1) {
          if (((adc == (int8 *)0x0) || (_j[(uint)tri + 2] == '\0')) &&
             (iVar2 = isDegenerate((uint16 *)(*(long *)adcbits + (ulong)(uint)tri * 2)), iVar2 == 0)
             ) {
            this->numTriangles = this->numTriangles + 1;
          }
        }
      }
      else {
        this->numTriangles = *(uint *)(adcbits + 8) / 3 + this->numTriangles;
      }
      uVar1 = *(uint *)(adcbits + 8);
    }
    adcbits = adcbits + 0x18;
    _j = _j + uVar1;
  }
  _matid = this->triangles;
  adcbits = (int8 *)MeshHeader::getMeshes(this_00);
  _j = adc;
  for (j_1 = 0; j_1 < this_00->numMeshes; j_1 = j_1 + 1) {
    if (*(uint *)(adcbits + 8) < 3) {
      uVar1 = *(uint *)(adcbits + 8);
    }
    else {
      iVar3 = MaterialList::findIndex(&this->matList,*(Material **)(adcbits + 0x10));
      if (this_00->flags == 1) {
        for (local_4c = 0; local_4c < *(int *)(adcbits + 8) - 2U; local_4c = local_4c + 1) {
          if (((adc == (int8 *)0x0) || (_j[local_4c + 2] == '\0')) &&
             (iVar2 = isDegenerate((uint16 *)(*(long *)adcbits + (ulong)local_4c * 2)), iVar2 == 0))
          {
            _matid->v[0] = *(uint16 *)(*(long *)adcbits + (ulong)local_4c * 2);
            _matid->v[1] = *(uint16 *)
                            (*(long *)adcbits + (ulong)(local_4c + 1 + (local_4c & 1)) * 2);
            _matid->v[2] = *(uint16 *)
                            (*(long *)adcbits + (ulong)((local_4c + 2) - (local_4c & 1)) * 2);
            _matid->matId = (uint16)iVar3;
            _matid = _matid + 1;
          }
        }
      }
      else {
        for (local_50 = 0; local_50 < *(int *)(adcbits + 8) - 2U; local_50 = local_50 + 3) {
          _matid->v[0] = *(uint16 *)(*(long *)adcbits + (ulong)local_50 * 2);
          _matid->v[1] = *(uint16 *)(*(long *)adcbits + (ulong)(local_50 + 1) * 2);
          _matid->v[2] = *(uint16 *)(*(long *)adcbits + (ulong)(local_50 + 2) * 2);
          _matid->matId = (uint16)iVar3;
          _matid = _matid + 1;
        }
      }
      uVar1 = *(uint *)(adcbits + 8);
    }
    adcbits = adcbits + 0x18;
    _j = _j + uVar1;
  }
  return;
}

Assistant:

void
Geometry::generateTriangles(int8 *adc)
{
	MeshHeader *header = this->meshHeader;
	assert(header != nil);

	this->numTriangles = 0;
	Mesh *m = header->getMeshes();
	int8 *adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			// shouldn't happen but it does
			adcbits += m->numIndices;
			m++;
			continue;
		}
		if(header->flags == MeshHeader::TRISTRIP){
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if(!(adc && adcbits[j+2]) &&
				   !isDegenerate(&m->indices[j]))
					this->numTriangles++;
			}
		}else
			this->numTriangles += m->numIndices/3;
		adcbits += m->numIndices;
		m++;
	}

	Triangle *tri = this->triangles;
	m = header->getMeshes();
	adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			adcbits += m->numIndices;
			m++;
			continue;
		}
		int32 matid = this->matList.findIndex(m->material);
		if(header->flags == MeshHeader::TRISTRIP)
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if((adc && adcbits[j+2]) ||
				   isDegenerate(&m->indices[j]))
					continue;
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1 + (j%2)];
				tri->v[2] = m->indices[j+2 - (j%2)];
				tri->matId = matid;
				tri++;
			}
		else
			for(uint32 j = 0; j < m->numIndices-2; j+=3){
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1];
				tri->v[2] = m->indices[j+2];
				tri->matId = matid;
				tri++;
			}
		adcbits += m->numIndices;
		m++;
	}
}